

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConstantValue.cpp
# Opt level: O0

ConstantRange __thiscall slang::ConstantRange::subrange(ConstantRange *this,ConstantRange select)

{
  bool bVar1;
  int32_t iVar2;
  ConstantRange *in_RDI;
  ConstantRange result;
  int32_t l;
  ConstantRange *in_stack_ffffffffffffffc8;
  ConstantRange local_24;
  int32_t local_1c;
  ConstantRange local_8;
  
  local_1c = lower((ConstantRange *)0x66c9ad);
  ConstantRange(&local_24);
  iVar2 = lower((ConstantRange *)0x66c9c5);
  local_24.left = iVar2 + local_1c;
  iVar2 = upper((ConstantRange *)0x66c9d7);
  local_24.right = iVar2 + local_1c;
  bVar1 = isLittleEndian(in_RDI);
  if (bVar1) {
    local_8.right = local_24.right;
    local_8.left = local_24.left;
  }
  else {
    local_8 = reverse(in_stack_ffffffffffffffc8);
  }
  return local_8;
}

Assistant:

ConstantRange ConstantRange::subrange(ConstantRange select) const {
    int32_t l = lower();
    ConstantRange result;
    result.left = select.lower() + l;
    result.right = select.upper() + l;

    SLANG_ASSERT(result.right <= upper());
    if (isLittleEndian())
        return result;
    else
        return result.reverse();
}